

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcControl::~IfcControl(IfcControl *this)

{
  undefined1 *puVar1;
  _func_int **pp_Var2;
  
  *(undefined8 *)&this[-1].super_IfcObject.field_0x60 = 0x80e5b8;
  *(undefined8 *)&(this->super_IfcObject).field_0x48 = 0x80e630;
  *(undefined8 *)&this[-1].field_0xe8 = 0x80e5e0;
  *(undefined8 *)&this->super_IfcObject = 0x80e608;
  puVar1 = *(undefined1 **)&(this->super_IfcObject).field_0x10;
  if (puVar1 != &(this->super_IfcObject).field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&this[-1].super_IfcObject.field_0x60 = 0x80e6d0;
  *(undefined8 *)&(this->super_IfcObject).field_0x48 = 0x80e6f8;
  puVar1 = *(undefined1 **)&this[-1].super_IfcObject.field_0xc0;
  if (puVar1 != &this[-1].super_IfcObject.field_0xd0) {
    operator_delete(puVar1);
  }
  pp_Var2 = this[-1].super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
            _vptr_ObjectHelper;
  if (pp_Var2 !=
      (_func_int **)
      &this[-1].super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
       field_0x10) {
    operator_delete(pp_Var2);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcObject.field_0x70;
  if (puVar1 != &this[-1].super_IfcObject.field_0x80) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcObject.field_0x60);
  return;
}

Assistant:

IfcControl() : Object("IfcControl") {}